

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint obmc_check_better_fast
               (MV *this_mv,MV *best_mv,SubpelMvLimits *mv_limits,
               SUBPEL_SEARCH_VAR_PARAMS *var_params,MV_COST_PARAMS *mv_cost_params,uint *besterr,
               uint *sse1,int *distortion,int *has_better_mv)

{
  int iVar1;
  int iVar2;
  MV_COST_PARAMS *in_RCX;
  SubpelMvLimits *in_RDX;
  uint *in_RSI;
  SUBPEL_SEARCH_VAR_PARAMS *in_RDI;
  uint *in_R9;
  MV *unaff_retaddr;
  undefined4 *in_stack_00000008;
  int thismse;
  uint sse;
  uint cost;
  undefined4 local_38;
  uint local_34;
  
  iVar1 = av1_is_subpelmv_in_range(in_RDX,*(MV *)&in_RDI->vfp);
  if (iVar1 == 0) {
    local_34 = 0x7fffffff;
  }
  else {
    iVar1 = estimate_obmc_pref_error(unaff_retaddr,in_RDI,in_RSI);
    iVar2 = estimate_obmc_mvcost((MV *)in_RDX,in_RCX);
    local_34 = iVar1 + iVar2;
    if (local_34 < *in_R9) {
      *in_R9 = local_34;
      *in_RSI = *(uint *)&in_RDI->vfp;
      *_sse = iVar1;
      *in_stack_00000008 = local_38;
      *besterr = *besterr | 1;
    }
  }
  return local_34;
}

Assistant:

static inline unsigned int obmc_check_better_fast(
    const MV *this_mv, MV *best_mv, const SubpelMvLimits *mv_limits,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    const int thismse = estimate_obmc_pref_error(this_mv, var_params, &sse);

    cost = estimate_obmc_mvcost(this_mv, mv_cost_params);
    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}